

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O1

void push_sorted_suite::push_increasing(void)

{
  int iVar1;
  int *piVar2;
  int __tmp;
  array<int,_4UL> storage;
  array<int,_4UL> expect;
  int local_28 [2];
  
  storage._M_elems[2] = 0;
  storage._M_elems[3] = 0;
  storage._M_elems[0] = 0xb;
  storage._M_elems[1] = 0;
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x442,"void push_sorted_suite::push_increasing()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_28);
  storage._M_elems[1] = 0x16;
  if (0x16 < storage._M_elems[0]) {
    storage._M_elems[1] = storage._M_elems[0];
    storage._M_elems[0] = 0x16;
  }
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x449,"void push_sorted_suite::push_increasing()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_28);
  piVar2 = storage._M_elems + 2;
  storage._M_elems[2] = 0x21;
  do {
    iVar1 = *piVar2;
    if (piVar2[-1] <= iVar1) break;
    *piVar2 = piVar2[-1];
    piVar2[-1] = iVar1;
    piVar2 = piVar2 + -1;
  } while ((array<int,_4UL> *)piVar2 != &storage);
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x450,"void push_sorted_suite::push_increasing()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_28);
  piVar2 = storage._M_elems + 3;
  storage._M_elems[3] = 0x2c;
  do {
    iVar1 = *piVar2;
    if (piVar2[-1] <= iVar1) break;
    *piVar2 = piVar2[-1];
    piVar2[-1] = iVar1;
    piVar2 = piVar2 + -1;
  } while ((array<int,_4UL> *)piVar2 != &storage);
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0x2c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x457,"void push_sorted_suite::push_increasing()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_28);
  return;
}

Assistant:

void push_increasing()
{
    std::array<int, 4> storage = { 0, 0, 0, 0 };
    auto last = storage.begin();
    *last++ = 11;
    push_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 11, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 22;
    push_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 11, 22, 0, 0 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 33;
    push_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 11, 22, 33, 0 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 44;
    push_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
}